

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  secp256k1_fe *in_RCX;
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  long in_R8;
  int in_R9D;
  secp256k1_fe *unaff_retaddr;
  uchar *theirs64;
  uchar sx [32];
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe px;
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_scalar s;
  int overflow;
  int ret;
  char *in_stack_fffffffffffffe98;
  secp256k1_fe *r;
  secp256k1_callback *in_stack_fffffffffffffea0;
  secp256k1_fe *r_00;
  uchar *in_stack_fffffffffffffea8;
  secp256k1_scalar *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffee4;
  secp256k1_scalar *in_stack_fffffffffffffee8;
  secp256k1_scalar *in_stack_fffffffffffffef0;
  secp256k1_scalar local_40;
  int local_3c;
  int local_38;
  secp256k1_fe *local_28;
  secp256k1_fe *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar1;
  
  local_38 = 0;
  if (in_RDI != (secp256k1_fe *)0x0) {
    if (in_RSI == (secp256k1_fe *)0x0) {
      secp256k1_callback_call(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar1 = 0;
    }
    else if (in_RDX == (secp256k1_fe *)0x0) {
      secp256k1_callback_call(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar1 = 0;
    }
    else if (in_RCX == (secp256k1_fe *)0x0) {
      secp256k1_callback_call(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar1 = 0;
    }
    else if (in_R8 == 0) {
      secp256k1_callback_call(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar1 = 0;
    }
    else if (theirs64 == (uchar *)0x0) {
      secp256k1_callback_call(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      uVar1 = 0;
    }
    else {
      r = in_RCX;
      if (in_R9D != 0) {
        r = in_RDX;
      }
      r_00 = r;
      local_28 = in_RCX;
      local_20 = in_RDX;
      secp256k1_fe_set_b32_mod(r,(uchar *)r);
      secp256k1_fe_set_b32_mod(r_00,(uchar *)r);
      secp256k1_ellswift_xswiftec_frac_var
                (unaff_retaddr,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 in_RDI,in_RSI);
      secp256k1_scalar_set_b32(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(int *)r_00);
      local_3c = secp256k1_scalar_is_zero((secp256k1_scalar *)0x109fab);
      secp256k1_scalar_cmov
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
      secp256k1_ecmult_const_xonly
                ((secp256k1_fe *)u.n[2],(secp256k1_fe *)u.n[1],(secp256k1_fe *)u.n[0],
                 (secp256k1_scalar *)t._40_8_,t.n[4]._4_4_);
      secp256k1_fe_normalize((secp256k1_fe *)0x10a005);
      secp256k1_fe_get_b32((uchar *)r_00,r);
      local_38 = (*(code *)theirs64)(in_RSI,&stack0xfffffffffffffea8,local_20,local_28,sx._0_8_);
      memset(&stack0xfffffffffffffea8,0,0x20);
      secp256k1_fe_clear((secp256k1_fe *)0x10a06b);
      secp256k1_scalar_clear(&local_40);
      uVar1 = (uint)(local_38 != 0 & (local_3c != 0 ^ 0xffU) & 1);
    }
    return uVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/ellswift/main_impl.h"
          ,0x22d,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    memset(sx, 0, 32);
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}